

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool duckdb::SubtractPropagateStatistics::Operation<long,duckdb::TrySubtractOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  long lVar2;
  long right;
  Value *this;
  int64_t in_RDI;
  long max;
  long min;
  Value *in_stack_ffffffffffffff28;
  BaseStatistics *in_stack_ffffffffffffff80;
  int64_t local_40;
  int64_t local_38 [5];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  lVar2 = NumericStats::GetMin<long>(in_stack_ffffffffffffff80);
  right = NumericStats::GetMax<long>(in_stack_ffffffffffffff80);
  bVar1 = TrySubtractOperator::Operation<long,long,long>(lVar2,right,local_38);
  if (bVar1) {
    this = (Value *)NumericStats::GetMax<long>(in_stack_ffffffffffffff80);
    lVar2 = NumericStats::GetMin<long>(in_stack_ffffffffffffff80);
    bVar1 = TrySubtractOperator::Operation<long,long,long>((int64_t)this,lVar2,&local_40);
    if (bVar1) {
      Value::Numeric((LogicalType *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     in_RDI);
      Value::operator=(this,in_stack_ffffffffffffff28);
      Value::~Value(this);
      Value::Numeric((LogicalType *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     in_RDI);
      Value::operator=(this,in_stack_ffffffffffffff28);
      Value::~Value(this);
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}